

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

void ATyCPU(CUPDLPwork *w,cupdlp_float *aty,cupdlp_float *y)

{
  CUPDLPproblem *pCVar1;
  long in_RDX;
  cupdlp_float *in_RSI;
  CUPDLPwork *in_RDI;
  cupdlp_int iRow;
  CUPDLPproblem *lp;
  int local_24;
  
  pCVar1 = in_RDI->problem;
  memset(in_RSI,0,(long)pCVar1->data->nCols << 3);
  for (local_24 = 0; local_24 < pCVar1->data->nRows; local_24 = local_24 + 1) {
    ScatterRow(in_RDI,local_24,*(cupdlp_float *)(in_RDX + (long)local_24 * 8),in_RSI);
  }
  return;
}

Assistant:

void ATyCPU(CUPDLPwork *w, cupdlp_float *aty, const cupdlp_float *y) {
  // #if PDHG_USE_TIMERS
  //     ++w->timers->nAtyCalls;
  //     cupdlp_float dStartTime = getTimeStamp();
  // #endif

  CUPDLPproblem *lp = w->problem;

  /* no indentity currently
  FILL_ZERO(aty, lp->nSeq);

  // [A I]'*y
  for (cupdlp_int iSeq = ncols, iRow = 0; iSeq < lp->nSeq; ++iSeq, ++iRow)
  {
      ScatterRow(pdhg, iRow, y[iRow], aty);

      if ((pdhg->lower[iSeq] > -INFINITY) && (pdhg->upper[iSeq] < INFINITY))
      {
          aty[iSeq] = (scaling->rowScale ? scaling->rowScale[iRow] * y[iRow] :
  y[iRow]);
      }
      else
      {
          aty[iSeq] = 0.0;
      }
  }
  */

  memset(aty, 0, sizeof(cupdlp_float) * lp->data->nCols);
  for (cupdlp_int iRow = 0; iRow < lp->data->nRows; ++iRow) {
    ScatterRow(w, iRow, y[iRow], aty);
  }

  // #if PDHG_USE_TIMERS
  //     w->timers->dAtyTime += getTimeStamp() - dStartTime;
  // #endif
}